

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_Duplicate(cJSON *item,int recurse)

{
  char *pcVar1;
  cJSON *pcVar2;
  cJSON *newchild;
  cJSON *nptr;
  cJSON *cptr;
  cJSON *newitem;
  int recurse_local;
  cJSON *item_local;
  
  newchild = (cJSON *)0x0;
  if (item == (cJSON *)0x0) {
    item_local = (cJSON *)0x0;
  }
  else {
    item_local = cJSON_New_Item();
    if (item_local == (cJSON *)0x0) {
      item_local = (cJSON *)0x0;
    }
    else {
      item_local->type = item->type & 0xfffffeff;
      item_local->valueint = item->valueint;
      item_local->valuedouble = item->valuedouble;
      if (item->valuestring != (char *)0x0) {
        pcVar1 = cJSON_strdup(item->valuestring);
        item_local->valuestring = pcVar1;
        if (item_local->valuestring == (char *)0x0) {
          cJSON_Delete(item_local);
          return (cJSON *)0x0;
        }
      }
      if (item->string != (char *)0x0) {
        pcVar1 = cJSON_strdup(item->string);
        item_local->string = pcVar1;
        if (item_local->string == (char *)0x0) {
          cJSON_Delete(item_local);
          return (cJSON *)0x0;
        }
      }
      if (recurse != 0) {
        for (nptr = item->child; nptr != (cJSON *)0x0; nptr = nptr->next) {
          pcVar2 = cJSON_Duplicate(nptr,1);
          if (pcVar2 == (cJSON *)0x0) {
            cJSON_Delete(item_local);
            return (cJSON *)0x0;
          }
          if (newchild == (cJSON *)0x0) {
            item_local->child = pcVar2;
          }
          else {
            newchild->next = pcVar2;
            pcVar2->prev = newchild;
          }
          newchild = pcVar2;
        }
      }
    }
  }
  return item_local;
}

Assistant:

cJSON *cJSON_Duplicate(cJSON *item,int recurse)
{
	cJSON *newitem,*cptr,*nptr=0,*newchild;
	/* Bail on bad ptr */
	if (!item) return 0;
	/* Create new item */
	newitem=cJSON_New_Item();
	if (!newitem) return 0;
	/* Copy over all vars */
	newitem->type=item->type&(~cJSON_IsReference),newitem->valueint=item->valueint,newitem->valuedouble=item->valuedouble;
	if (item->valuestring)	{newitem->valuestring=cJSON_strdup(item->valuestring);	if (!newitem->valuestring)	{cJSON_Delete(newitem);return 0;}}
	if (item->string)		{newitem->string=cJSON_strdup(item->string);			if (!newitem->string)		{cJSON_Delete(newitem);return 0;}}
	/* If non-recursive, then we're done! */
	if (!recurse) return newitem;
	/* Walk the ->next chain for the child. */
	cptr=item->child;
	while (cptr)
	{
		newchild=cJSON_Duplicate(cptr,1);		/* Duplicate (with recurse) each item in the ->next chain */
		if (!newchild) {cJSON_Delete(newitem);return 0;}
		if (nptr)	{nptr->next=newchild,newchild->prev=nptr;nptr=newchild;}	/* If newitem->child already set, then crosswire ->prev and ->next and move on */
		else		{newitem->child=newchild;nptr=newchild;}					/* Set newitem->child and move to it */
		cptr=cptr->next;
	}
	return newitem;
}